

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::LDA_AB_X(CPU *this)

{
  uint8_t uVar1;
  uint16_t uVar2;
  uint16_t address;
  CPU *this_local;
  
  this->cycles = 4;
  uVar2 = GetWord(this);
  uVar1 = ReadByte(this,uVar2 + this->X);
  this->A = uVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->A == '\0') << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((this->A & 0x80) != 0 && -1 < (int)(this->A & 0x80)) << 7;
  return;
}

Assistant:

void CPU::LDA_AB_X()
{
    cycles = 4;
    uint16_t address = GetWord();
    A = ReadByte(address + X);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}